

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# acbFunc.c
# Opt level: O1

Vec_Int_t * Acb_NtkFindSupp(Acb_Ntk_t *p,Vec_Int_t *vRoots)

{
  uint uVar1;
  int iVar2;
  Vec_Int_t *vSupp;
  int *piVar3;
  long lVar4;
  
  vSupp = (Vec_Int_t *)malloc(0x10);
  vSupp->nCap = 1000;
  vSupp->nSize = 0;
  piVar3 = (int *)malloc(4000);
  vSupp->pArray = piVar3;
  if ((p->vObjTrav).nSize < 1) {
    uVar1 = (p->vObjType).nCap;
    if ((p->vObjTrav).nCap < (int)uVar1) {
      piVar3 = (p->vObjTrav).pArray;
      if (piVar3 == (int *)0x0) {
        piVar3 = (int *)malloc((long)(int)uVar1 << 2);
      }
      else {
        piVar3 = (int *)realloc(piVar3,(long)(int)uVar1 << 2);
      }
      (p->vObjTrav).pArray = piVar3;
      if (piVar3 == (int *)0x0) {
        __assert_fail("p->pArray",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/misc/vec/vecInt.h"
                      ,0x215,"void Vec_IntGrow(Vec_Int_t *, int)");
      }
      (p->vObjTrav).nCap = uVar1;
    }
    if (0 < (int)uVar1) {
      memset((p->vObjTrav).pArray,0,(ulong)uVar1 * 4);
    }
    (p->vObjTrav).nSize = uVar1;
  }
  p->nObjTravs = p->nObjTravs + 1;
  if (0 < vRoots->nSize) {
    lVar4 = 0;
    do {
      iVar2 = vRoots->pArray[lVar4];
      if (((long)iVar2 < 0) || ((p->vCos).nSize <= iVar2)) {
LAB_0036d45a:
        __assert_fail("i >= 0 && i < p->nSize",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/misc/vec/vecInt.h"
                      ,0x1a7,"int Vec_IntEntry(Vec_Int_t *, int)");
      }
      iVar2 = (p->vCos).pArray[iVar2];
      if ((long)iVar2 < 1) {
        __assert_fail("i>0",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/base/acb/acb.h"
                      ,0xfe,"int Acb_ObjFanOffset(Acb_Ntk_t *, int)");
      }
      if ((p->vObjFans).nSize <= iVar2) goto LAB_0036d45a;
      iVar2 = (p->vObjFans).pArray[iVar2];
      if (((long)iVar2 < 0) || ((p->vFanSto).nSize <= iVar2)) {
        __assert_fail("i >= 0 && i < p->nSize",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/misc/vec/vecInt.h"
                      ,0x1b8,"int *Vec_IntEntryP(Vec_Int_t *, int)");
      }
      Acb_NtkFindSupp_rec(p,(p->vFanSto).pArray[(long)iVar2 + 1],vSupp);
      lVar4 = lVar4 + 1;
    } while (lVar4 < vRoots->nSize);
  }
  qsort(vSupp->pArray,(long)vSupp->nSize,4,Vec_IntSortCompare1);
  return vSupp;
}

Assistant:

Vec_Int_t * Acb_NtkFindSupp( Acb_Ntk_t * p, Vec_Int_t * vRoots )
{
    int i, iObj;
    Vec_Int_t * vSupp  = Vec_IntAlloc( 1000 );
    Acb_NtkIncTravId( p );
    Acb_NtkForEachCoDriverVec( vRoots, p, iObj, i )
        Acb_NtkFindSupp_rec( p, iObj, vSupp );
    Vec_IntSort( vSupp, 0 );
    //Vec_IntPrint( vSupp );
    return vSupp;
}